

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# global_object.cpp
# Opt level: O3

object_ptr __thiscall mjs::global_object::make_arguments_array(global_object *this)

{
  size_t num_bytes;
  undefined8 extraout_RDX;
  long *in_RSI;
  object_ptr oVar1;
  object_ptr op;
  undefined1 auStack_48 [16];
  undefined1 local_38 [32];
  
  (**(code **)(*in_RSI + 0x58))(local_38 + 0x10);
  num_bytes = in_RSI[1];
  if ((int)in_RSI[4] < 2) {
    gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)(local_38 + 0x10));
    object::class_name((object *)auStack_48);
  }
  else {
    (**(code **)(*in_RSI + 0x98))(auStack_48);
  }
  gc_heap::
  allocate_and_construct<mjs::arguments_array_object,mjs::string,mjs::gc_heap_ptr<mjs::object>&>
            ((gc_heap *)local_38,num_bytes,(string *)0x20,(gc_heap_ptr<mjs::object> *)auStack_48);
  (this->super_object)._vptr_object = (_func_int **)local_38._0_8_;
  *(undefined4 *)&(this->super_object).heap_ = local_38._8_4_;
  if ((gc_heap *)local_38._0_8_ != (gc_heap *)0x0) {
    gc_heap::attach((gc_heap *)local_38._0_8_,(gc_heap_ptr_untyped *)this);
  }
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)local_38);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)auStack_48);
  gc_heap_ptr_untyped::~gc_heap_ptr_untyped((gc_heap_ptr_untyped *)(local_38 + 0x10));
  oVar1.super_gc_heap_ptr_untyped._8_8_ = extraout_RDX;
  oVar1.super_gc_heap_ptr_untyped.heap_ = (gc_heap *)this;
  return (object_ptr)oVar1.super_gc_heap_ptr_untyped;
}

Assistant:

object_ptr global_object::make_arguments_array() {
    auto op = object_prototype();
    return heap().make<arguments_array_object>(language_version() >= version::es5 ? common_string("Arguments") : op->class_name(), op);
}